

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O3

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindGreaterOrEqual
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key,Node **prev)

{
  int iVar1;
  uint uVar2;
  Node *pNVar3;
  Node *pNVar4;
  
  iVar1 = (this->max_height_).super___atomic_base<int>._M_i;
  if (0 < iVar1) {
    uVar2 = iVar1 - 1;
    pNVar3 = this->head_;
    do {
      pNVar4 = pNVar3->next_[uVar2]._M_b._M_p;
      if ((pNVar4 == (Node *)0x0) ||
         (iVar1 = MemTable::KeyComparator::operator()(&this->compare_,pNVar4->key,*key), -1 < iVar1)
         ) {
        if (prev != (Node **)0x0) {
          prev[uVar2] = pNVar3;
        }
        if (uVar2 == 0) {
          return pNVar4;
        }
        uVar2 = uVar2 - 1;
        pNVar4 = pNVar3;
      }
      pNVar3 = pNVar4;
    } while (-1 < (int)uVar2);
  }
  __assert_fail("n >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/skiplist.h"
                ,0x9a,
                "Node *leveldb::SkipList<const char *, leveldb::MemTable::KeyComparator>::Node::Next(int) [Key = const char *, Comparator = leveldb::MemTable::KeyComparator]"
               );
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindGreaterOrEqual(const Key& key,
                                              Node** prev) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    Node* next = x->Next(level);
    if (KeyIsAfterNode(key, next)) {
      // Keep searching in this list
      x = next;
    } else {
      if (prev != nullptr) prev[level] = x;
      if (level == 0) {
        return next;
      } else {
        // Switch to next list
        level--;
      }
    }
  }
}